

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking_hugeint.cpp
# Opt level: O0

void duckdb::HugeIntPacker::Unpack(uint32_t *in,uhugeint_t *out,bitpacking_width_t width)

{
  char in_DL;
  uint32_t *in_RSI;
  idx_t oindex;
  uhugeint_t *in_stack_00000048;
  uint32_t *in_stack_00000050;
  uint16_t in_stack_00000076;
  uhugeint_t *in_stack_00000078;
  uint32_t **in_stack_00000080;
  uint16_t in_stack_00000304;
  uint16_t in_stack_00000306;
  uhugeint_t *in_stack_00000308;
  uint32_t **in_stack_00000310;
  undefined8 local_20;
  uint7 in_stack_ffffffffffffffe8;
  
  if (in_DL == '\0') {
    UnpackDelta0(in_RSI,(uhugeint_t *)(ulong)in_stack_ffffffffffffffe8);
  }
  else if (in_DL == ' ') {
    UnpackDelta32(in_RSI,(uhugeint_t *)CONCAT17(0x20,in_stack_ffffffffffffffe8));
  }
  else if (in_DL == '@') {
    UnpackDelta64(in,out);
  }
  else if (in_DL == '`') {
    UnpackDelta96(in_stack_00000050,in_stack_00000048);
  }
  else if (in_DL == -0x80) {
    UnpackDelta128((uint32_t *)in_stack_00000080,in_stack_00000078);
  }
  else {
    for (local_20 = 0; local_20 < 0x1f; local_20 = local_20 + 1) {
      UnpackSingle(in_stack_00000310,in_stack_00000308,in_stack_00000306,in_stack_00000304);
    }
    UnpackLast(in_stack_00000080,in_stack_00000078,in_stack_00000076);
  }
  return;
}

Assistant:

void HugeIntPacker::Unpack(const uint32_t *__restrict in, uhugeint_t *__restrict out, bitpacking_width_t width) {
	D_ASSERT(width <= 128);
	switch (width) {
	case 0:
		UnpackDelta0(in, out);
		break;
	case 32:
		UnpackDelta32(in, out);
		break;
	case 64:
		UnpackDelta64(in, out);
		break;
	case 96:
		UnpackDelta96(in, out);
		break;
	case 128:
		UnpackDelta128(in, out);
		break;
	default:
		for (idx_t oindex = 0; oindex < BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE - 1; ++oindex) {
			UnpackSingle(in, out + oindex, width,
			             (width * oindex) % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE);
		}
		UnpackLast(in, out, width);
	}
}